

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void WriteVars(FSerializer *file,SDWORD *vars,size_t count,char *key)

{
  ulong local_38;
  size_t j;
  size_t i;
  char *key_local;
  size_t count_local;
  SDWORD *vars_local;
  FSerializer *file_local;
  
  for (j = 0; (j < count && (vars[j] == 0)); j = j + 1) {
  }
  if (j < count) {
    for (local_38 = count - 1; (j < local_38 && (vars[local_38] == 0)); local_38 = local_38 - 1) {
    }
    FSerializer::Array<int>(file,key,vars,(int)local_38 + 1,false);
  }
  return;
}

Assistant:

static void WriteVars (FSerializer &file, SDWORD *vars, size_t count, const char *key)
{
	size_t i, j;

	for (i = 0; i < count; ++i)
	{
		if (vars[i] != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-zero var. Anything beyond the last stored variable
		// will be zeroed at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j] != 0)
				break;
		}
		file.Array(key, vars, int(j+1));
	}
}